

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O2

void __thiscall wabt::AST::Construct(AST *this,Expr *e)

{
  ModuleContext *pMVar1;
  BlockExprBase<(wabt::ExprType)8> *be;
  BlockExprBase<(wabt::ExprType)27> *be_00;
  VarExpr<(wabt::ExprType)20> *ve;
  VarExpr<(wabt::ExprType)21> *ve_00;
  BrTableExpr *pBVar2;
  Label *pLVar3;
  VarExpr<(wabt::ExprType)10> *pVVar4;
  VarExpr<(wabt::ExprType)9> *pVVar5;
  Node *pNVar6;
  IfExpr *pIVar7;
  VarExpr<(wabt::ExprType)24> *ve_01;
  VarExpr<(wabt::ExprType)26> *ve_02;
  VarExpr<(wabt::ExprType)25> *ve_03;
  ExprType EVar8;
  LabelType LVar9;
  Index IVar10;
  Arities AVar11;
  
  AVar11 = ModuleContext::GetExprArity(this->mc,e);
  EVar8 = e->type_;
  switch(EVar8) {
  case Block:
    be = cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(e);
    Block<(wabt::ExprType)8>(this,be,Block);
    return;
  case Br:
    pMVar1 = this->mc;
    pVVar5 = cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(e);
    pLVar3 = ModuleContext::GetLabel(pMVar1,&pVVar5->var);
    LVar9 = pLVar3->label_type;
    EVar8 = Br;
    IVar10 = 0;
    goto LAB_00155927;
  case BrIf:
    pMVar1 = this->mc;
    pVVar4 = cast<wabt::VarExpr<(wabt::ExprType)10>,wabt::Expr>(e);
    pLVar3 = ModuleContext::GetLabel(pMVar1,&pVVar4->var);
    LVar9 = pLVar3->label_type;
    EVar8 = BrIf;
    break;
  case BrTable:
    pMVar1 = this->mc;
    pBVar2 = cast<wabt::BrTableExpr,wabt::Expr>(e);
    pLVar3 = ModuleContext::GetLabel(pMVar1,&pBVar2->default_target);
    LVar9 = pLVar3->label_type;
    EVar8 = BrTable;
    break;
  default:
    IVar10 = AVar11.nargs;
    goto LAB_00155a83;
  case GlobalGet:
    ve = cast<wabt::VarExpr<(wabt::ExprType)20>,wabt::Expr>(e);
    Get<(wabt::ExprType)20>(this,ve,false);
    return;
  case GlobalSet:
    ve_00 = cast<wabt::VarExpr<(wabt::ExprType)21>,wabt::Expr>(e);
    Set<(wabt::ExprType)21>(this,ve_00,false);
    return;
  case If:
    pIVar7 = cast<wabt::IfExpr,wabt::Expr>(e);
    this->value_stack_depth = this->value_stack_depth + -1;
    ModuleContext::BeginBlock(this->mc,Block,&pIVar7->true_);
    Construct(this,&(pIVar7->true_).exprs,
              (Index)((ulong)((long)*(pointer *)
                                     ((long)&(pIVar7->true_).decl.sig.result_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data + 8) -
                             (long)(pIVar7->true_).decl.sig.result_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3),
              (Index)((ulong)((long)*(pointer *)
                                     ((long)&(pIVar7->true_).decl.sig.param_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data + 8) -
                             (long)(pIVar7->true_).decl.sig.param_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3),false);
    if ((pIVar7->false_).size_ != 0) {
      Construct(this,&pIVar7->false_,
                (Index)((ulong)((long)*(pointer *)
                                       ((long)&(pIVar7->true_).decl.sig.result_types.
                                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                               ._M_impl.super__Vector_impl_data + 8) -
                               (long)(pIVar7->true_).decl.sig.result_types.
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 3),
                (Index)((ulong)((long)*(pointer *)
                                       ((long)&(pIVar7->true_).decl.sig.param_types.
                                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                               ._M_impl.super__Vector_impl_data + 8) -
                               (long)(pIVar7->true_).decl.sig.param_types.
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 3),false);
    }
    ModuleContext::EndBlock(this->mc);
    this->value_stack_depth = this->value_stack_depth + 1;
    IVar10 = 3 - ((pIVar7->false_).size_ == 0);
    EVar8 = If;
LAB_00155a83:
    InsertNode(this,Expr,EVar8,e,IVar10);
    return;
  case LocalGet:
    ve_01 = cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(e);
    Get<(wabt::ExprType)24>(this,ve_01,true);
    return;
  case LocalSet:
    ve_03 = cast<wabt::VarExpr<(wabt::ExprType)25>,wabt::Expr>(e);
    Set<(wabt::ExprType)25>(this,ve_03,true);
    return;
  case LocalTee:
    ve_02 = cast<wabt::VarExpr<(wabt::ExprType)26>,wabt::Expr>(e);
    Set<(wabt::ExprType)26>(this,ve_02,true);
    if (this->value_stack_depth != 1) {
      return;
    }
    Get<(wabt::ExprType)26>(this,ve_02,true);
    return;
  case Loop:
    be_00 = cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(e);
    Block<(wabt::ExprType)27>(this,be_00,Loop);
    return;
  }
  IVar10 = 1;
LAB_00155927:
  pNVar6 = InsertNode(this,Expr,EVar8,e,IVar10);
  (pNVar6->u).field_0.var_start = LVar9;
  return;
}

Assistant:

void Construct(const Expr& e) {
    auto arity = mc.GetExprArity(e);
    switch (e.type()) {
      case ExprType::LocalGet: {
        Get(*cast<LocalGetExpr>(&e), true);
        return;
      }
      case ExprType::GlobalGet: {
        Get(*cast<GlobalGetExpr>(&e), false);
        return;
      }
      case ExprType::LocalSet: {
        Set(*cast<LocalSetExpr>(&e), true);
        return;
      }
      case ExprType::GlobalSet: {
        Set(*cast<GlobalSetExpr>(&e), false);
        return;
      }
      case ExprType::LocalTee: {
        auto& lt = *cast<LocalTeeExpr>(&e);
        Set(lt, true);
        if (value_stack_depth == 1) {  // Tee is the only thing on there.
          Get(lt, true);               // Now Set + Get instead.
        } else {
          // Things are above us on the stack so the Tee can't be eliminated.
          // The Set makes this work as a Tee when consumed by a parent.
        }
        return;
      }
      case ExprType::If: {
        auto ife = cast<IfExpr>(&e);
        value_stack_depth--;  // Condition.
        mc.BeginBlock(LabelType::Block, ife->true_);
        Construct(ife->true_.exprs, ife->true_.decl.GetNumResults(),
                  ife->true_.decl.GetNumParams(), false);
        if (!ife->false_.empty()) {
          Construct(ife->false_, ife->true_.decl.GetNumResults(),
                    ife->true_.decl.GetNumParams(), false);
        }
        mc.EndBlock();
        value_stack_depth++;  // Put Condition back.
        InsertNode(NodeType::Expr, ExprType::If, &e,
                   ife->false_.empty() ? 2 : 3);
        return;
      }
      case ExprType::Block: {
        Block(*cast<BlockExpr>(&e), LabelType::Block);
        return;
      }
      case ExprType::Loop: {
        Block(*cast<LoopExpr>(&e), LabelType::Loop);
        return;
      }
      case ExprType::Br: {
        InsertNode(NodeType::Expr, ExprType::Br, &e, 0).u.lt =
            mc.GetLabel(cast<BrExpr>(&e)->var)->label_type;
        return;
      }
      case ExprType::BrIf: {
        InsertNode(NodeType::Expr, ExprType::BrIf, &e, 1).u.lt =
            mc.GetLabel(cast<BrIfExpr>(&e)->var)->label_type;
        return;
      }
      case ExprType::BrTable: {
        InsertNode(NodeType::Expr, ExprType::BrTable, &e, 1).u.lt =
            mc.GetLabel(cast<BrTableExpr>(&e)->default_target)->label_type;
        return;
      }
      default: {
        InsertNode(NodeType::Expr, e.type(), &e, arity.nargs);
        return;
      }
    }
  }